

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

char * imm_bit_name(long *imm_flags)

{
  ulong uVar1;
  char *pcVar2;
  ulong *in_RDI;
  __type_conflict2 _Var3;
  
  imm_bit_name::buf[0] = '\0';
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdd85);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," summon");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fddd0);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," charm");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fde18);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," magic");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fde63);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," weapon");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdeae);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," blunt");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdef9);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," piercing");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdf44);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," slashing");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdf8f);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," fire");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdfda);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," cold");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe025);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," lightning");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe06d);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," acid");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe0b2);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," poison");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe0f7);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," negative");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe13c);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," holy");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe181);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," energy");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe1c6);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," mental");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe20b);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," disease");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe250);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," drowning");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe295);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," light");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe2da);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," iron");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe31f);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," mithril");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe364);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," silver");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe3a9);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," sleep");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe3ee);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," sound");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fe433);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(imm_bit_name::buf," internal");
  }
  pcVar2 = " none";
  if (imm_bit_name::buf[0] != '\0') {
    pcVar2 = imm_bit_name::buf;
  }
  return pcVar2 + 1;
}

Assistant:

char *imm_bit_name(long imm_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(imm_flags, IMM_SUMMON))
		strcat(buf, " summon");

	if (IS_SET(imm_flags, IMM_CHARM))
		strcat(buf, " charm");

	if (IS_SET(imm_flags, IMM_MAGIC))
		strcat(buf, " magic");

	if (IS_SET(imm_flags, IMM_WEAPON))
		strcat(buf, " weapon");

	if (IS_SET(imm_flags, IMM_BASH))
		strcat(buf, " blunt");

	if (IS_SET(imm_flags, IMM_PIERCE))
		strcat(buf, " piercing");

	if (IS_SET(imm_flags, IMM_SLASH))
		strcat(buf, " slashing");

	if (IS_SET(imm_flags, IMM_FIRE))
		strcat(buf, " fire");

	if (IS_SET(imm_flags, IMM_COLD))
		strcat(buf, " cold");

	if (IS_SET(imm_flags, IMM_LIGHTNING))
		strcat(buf, " lightning");

	if (IS_SET(imm_flags, IMM_ACID))
		strcat(buf, " acid");

	if (IS_SET(imm_flags, IMM_POISON))
		strcat(buf, " poison");

	if (IS_SET(imm_flags, IMM_NEGATIVE))
		strcat(buf, " negative");

	if (IS_SET(imm_flags, IMM_HOLY))
		strcat(buf, " holy");

	if (IS_SET(imm_flags, IMM_ENERGY))
		strcat(buf, " energy");

	if (IS_SET(imm_flags, IMM_MENTAL))
		strcat(buf, " mental");

	if (IS_SET(imm_flags, IMM_DISEASE))
		strcat(buf, " disease");

	if (IS_SET(imm_flags, IMM_DROWNING))
		strcat(buf, " drowning");

	if (IS_SET(imm_flags, IMM_LIGHT))
		strcat(buf, " light");

	if (IS_SET(imm_flags, IMM_IRON))
		strcat(buf, " iron");

	if (IS_SET(imm_flags, IMM_MITHRIL))
		strcat(buf, " mithril");

	if (IS_SET(imm_flags, IMM_SILVER))
		strcat(buf, " silver");

	if (IS_SET(imm_flags, IMM_SLEEP))
		strcat(buf, " sleep");

	if (IS_SET(imm_flags, IMM_SOUND))
		strcat(buf, " sound");

	if (IS_SET(imm_flags, IMM_INTERNAL))

		strcat(buf, " internal");
	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}